

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_gsupport.cpp
# Opt level: O0

void __kmp_GOMP_doacross_wait<long>(long first,__va_list_tag *args)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined8 *puVar4;
  kmp_info_t *in_RSI;
  undefined8 in_RDI;
  kmp_int64 *in_stack_00000010;
  long item;
  kmp_int64 i;
  kmp_int64 *vec;
  kmp_int64 num_dims;
  kmp_info_t *th;
  int gtid;
  undefined8 *in_stack_ffffffffffffffa8;
  kmp_info_t *in_stack_ffffffffffffffb0;
  long local_38;
  
  iVar3 = __kmp_get_global_thread_id_reg();
  lVar2 = *(((__kmp_threads[iVar3]->th).th_dispatch)->field_8).th_doacross_info;
  puVar4 = (undefined8 *)
           ___kmp_thread_malloc(in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  *puVar4 = in_RDI;
  for (local_38 = 1; local_38 < lVar2; local_38 = local_38 + 1) {
    uVar1 = *(uint *)in_RSI;
    if (uVar1 < 0x29) {
      in_stack_ffffffffffffffa8 =
           (undefined8 *)((long)(int)uVar1 + *(long *)(in_RSI->th_pad + 0x10));
      *(uint *)in_RSI = uVar1 + 8;
    }
    else {
      in_stack_ffffffffffffffa8 = *(undefined8 **)(in_RSI->th_pad + 8);
      *(undefined8 **)(in_RSI->th_pad + 8) = in_stack_ffffffffffffffa8 + 1;
    }
    puVar4[local_38] = *in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffffb0 = in_RSI;
  }
  __kmpc_doacross_wait((ident_t *)i,item._4_4_,in_stack_00000010);
  ___kmp_thread_free(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void __kmp_GOMP_doacross_wait(T first, va_list args) {
  int gtid = __kmp_entry_gtid();
  kmp_info_t *th = __kmp_threads[gtid];
  MKLOC(loc, "GOMP_doacross_wait");
  kmp_int64 num_dims = th->th.th_dispatch->th_doacross_info[0];
  kmp_int64 *vec =
      (kmp_int64 *)__kmp_thread_malloc(th, sizeof(kmp_int64) * num_dims);
  vec[0] = (kmp_int64)first;
  for (kmp_int64 i = 1; i < num_dims; ++i) {
    T item = va_arg(args, T);
    vec[i] = (kmp_int64)item;
  }
  __kmpc_doacross_wait(&loc, gtid, vec);
  __kmp_thread_free(th, vec);
  return;
}